

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int gap_lr_spill_cost(gen_ctx_t gen_ctx,live_range_t_conflict lr)

{
  bb_t *ppbVar1;
  undefined4 *puVar2;
  undefined1 auVar3 [32];
  byte bVar4;
  uint uVar5;
  bb_t_conflict pbVar6;
  bb_t pbVar7;
  bitmap_el_t bVar8;
  MIR_reg_t *pMVar9;
  HTAB_MIR_item_t *pHVar10;
  ulong *puVar11;
  long *plVar12;
  void *pvVar13;
  VARR_MIR_reg_t *pVVar14;
  VARR_spill_cache_el_t *pVVar15;
  spill_cache_el_t *psVar16;
  bitmap_t *ppVVar17;
  VARR_live_range_t *pVVar18;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  MIR_op_mode_t MVar25;
  MIR_type_t MVar26;
  MIR_reg_t MVar27;
  int iVar28;
  int iVar29;
  live_range_t_conflict in_RAX;
  lr_bb_t_conflict plVar30;
  bitmap_el_t *pbVar31;
  ra_ctx *prVar32;
  ulong uVar33;
  MIR_insn_t_conflict pMVar34;
  int64_t iVar35;
  MIR_insn_t_conflict insn;
  undefined1 (*pauVar36) [32];
  live_range_t_conflict plVar37;
  MIR_error_func_t p_Var38;
  char cVar39;
  int iVar40;
  uint uVar41;
  int iVar42;
  bitmap_el_t *in_RCX;
  ulong uVar43;
  MIR_insn_t pMVar44;
  long lVar45;
  MIR_disp_t disp;
  MIR_reg_t base_reg;
  MIR_reg_t base_reg_00;
  int extraout_EDX;
  in_edge_t_conflict peVar46;
  bb_t extraout_RDX;
  DLIST_in_edge_t *pDVar47;
  char *pcVar48;
  MIR_context_t bm;
  gen_ctx_t unaff_RBX;
  gen_ctx_t pgVar49;
  gen_ctx_t pgVar50;
  FILE *pFVar51;
  MIR_error_func_t p_Var52;
  ulong unaff_RBP;
  loop_node_t_conflict plVar53;
  gen_ctx_t pgVar54;
  ulong uVar55;
  VARR_bitmap_t *pVVar56;
  code *nb;
  gen_ctx_t pgVar57;
  gen_ctx_t pgVar58;
  ulong uVar59;
  gen_ctx_t pgVar60;
  MIR_context_t pMVar61;
  MIR_context_t pMVar62;
  gen_ctx_t in_R8;
  long lVar63;
  uint uVar64;
  bb_t in_R9;
  loop_node_t_conflict loop_node_2;
  loop_node_t_conflict loop_node_1;
  long lVar65;
  gen_ctx_t unaff_R12;
  uint *puVar66;
  ulong uVar67;
  DLIST_LINK_bb_t *pDVar68;
  lr_bb_t_conflict unaff_R13;
  uint *puVar69;
  uint *puVar70;
  ulong unaff_R14;
  bitmap_t pVVar71;
  bitmap_t pVVar72;
  size_t sVar73;
  gen_ctx_t unaff_R15;
  bool bVar74;
  lr_gap_t el;
  MIR_reg_t MStack_418;
  MIR_op_t MStack_3d0;
  ulong *puStack_398;
  ulong uStack_390;
  bitmap_el_t *pbStack_388;
  ulong uStack_380;
  gen_ctx_t pgStack_378;
  code *pcStack_370;
  uint uStack_2ac;
  uint uStack_2a8;
  int iStack_2a4;
  DLIST_in_edge_t *pDStack_2a0;
  DLIST_LINK_bb_t *pDStack_298;
  MIR_insn_t_conflict pMStack_290;
  size_t sStack_288;
  MIR_insn_t pMStack_280;
  MIR_op_t MStack_278;
  MIR_op_t MStack_248;
  MIR_op_t MStack_218;
  bb_t pbStack_1e8;
  bb_t pbStack_1e0;
  in_edge_t_conflict peStack_1d8;
  in_edge_t_conflict peStack_1d0;
  out_edge_t peStack_1c8;
  out_edge_t peStack_1c0;
  bb_insn_t pbStack_1b8;
  bb_insn_t pbStack_1b0;
  bitmap_t pVStack_1a8;
  bitmap_t pVStack_1a0;
  bitmap_t pVStack_198;
  bitmap_t pVStack_190;
  int aiStack_188 [12];
  undefined1 auStack_158 [16];
  undefined1 auStack_148 [16];
  undefined1 auStack_138 [16];
  gen_ctx_t pgStack_f0;
  gen_ctx_t pgStack_e8;
  lr_bb_t_conflict plStack_e0;
  bitmap_t pVStack_d8;
  gen_ctx_t pgStack_d0;
  code *pcStack_c8;
  gen_ctx_t pgStack_b8;
  gen_ctx_t pgStack_b0;
  gen_ctx_t pgStack_a8;
  bb_t pbStack_a0;
  lr_bb_t_conflict plStack_98;
  uint uStack_8c;
  gen_ctx_t pgStack_88;
  gen_ctx_t pgStack_80;
  ulong uStack_78;
  bitmap_el_t *pbStack_70;
  gen_ctx_t pgStack_68;
  gen_ctx_t pgStack_60;
  lr_bb_t_conflict plStack_58;
  ulong uStack_50;
  gen_ctx_t pgStack_48;
  code *pcStack_40;
  live_range_t_conflict local_38;
  
  pVVar71 = gen_ctx->temp_bitmap;
  pgVar57 = gen_ctx;
  local_38 = in_RAX;
  if ((pVVar71 != (bitmap_t)0x0) && (pVVar71->varr != (bitmap_el_t *)0x0)) {
    pVVar71->els_num = 0;
    unaff_R14 = 0;
    unaff_R13 = lr->lr_bb;
    if (unaff_R13 != (lr_bb_t_conflict)0x0) {
      unaff_RBP = 1;
      local_38 = lr;
      do {
        unaff_R12 = (gen_ctx_t)gen_ctx->temp_bitmap;
        unaff_R15 = (gen_ctx_t)unaff_R13->bb->index;
        lr = (live_range_t_conflict)((long)&unaff_R15->ctx + 1);
        pcStack_40 = (code *)0x16e073;
        pgVar57 = unaff_R12;
        bitmap_expand((bitmap_t)unaff_R12,(size_t)lr);
        if (unaff_R12 == (gen_ctx_t)0x0) {
          pcStack_40 = (code *)0x16e21b;
          gap_lr_spill_cost_cold_3();
          goto LAB_0016e21b;
        }
        in_RCX = (bitmap_el_t *)((ulong)unaff_R15 >> 6);
        ppbVar1 = &((DLIST_LINK_in_edge_t *)&unaff_R12->curr_func_item)->prev->src + (long)in_RCX;
        *ppbVar1 = (bb_t)((ulong)*ppbVar1 | 1L << ((ulong)unaff_R15 & 0x3f));
        unaff_R13 = unaff_R13->next;
      } while (unaff_R13 != (lr_bb_t_conflict)0x0);
      plVar30 = local_38->lr_bb;
      if (plVar30 != (lr_bb_t_conflict)0x0) {
        unaff_R14 = 0;
        do {
          pbVar6 = plVar30->bb;
          plVar53 = pbVar6->loop_node;
          iVar40 = -2;
          do {
            iVar28 = iVar40;
            plVar53 = plVar53->parent;
            iVar40 = iVar28 + 1;
          } while (plVar53 != (loop_node_t)0x0);
          if (iVar40 < 0) {
LAB_0016e1f7:
            pcStack_40 = (code *)0x16e216;
            __assert_fail("level >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1748,"int bb_loop_level(bb_t)");
          }
          lr = (live_range_t_conflict)(pbVar6->out_edges).head;
          uVar41 = iVar28 + 2;
          in_RCX = (bitmap_el_t *)(ulong)uVar41;
          if ((gen_ctx_t)lr != (gen_ctx_t)0x0) {
            in_R8 = (gen_ctx_t)gen_ctx->temp_bitmap;
            if (in_R8 == (gen_ctx_t)0x0) goto LAB_0016e21b;
            pgVar57 = (gen_ctx_t)0xffffffff;
            in_R9 = (bb_t)((long)in_R8->ctx << 6);
            do {
              pbVar7 = (bb_t)(*(bb_t *)&((gen_ctx_t)lr)->optimize_level)->index;
              if (pbVar7 < in_R9) {
                unaff_R12 = (gen_ctx_t)((ulong)pbVar7 >> 6);
                unaff_R15 = (gen_ctx_t)
                            (&((DLIST_LINK_in_edge_t *)&in_R8->curr_func_item)->prev->src)
                            [(long)unaff_R12];
                if (((ulong)unaff_R15 >> ((ulong)pbVar7 & 0x3f) & 1) == 0) goto LAB_0016e114;
              }
              else {
LAB_0016e114:
                plVar53 = (*(bb_t *)&((gen_ctx_t)lr)->optimize_level)->loop_node;
                iVar40 = -2;
                do {
                  iVar28 = iVar40;
                  plVar53 = plVar53->parent;
                  iVar40 = iVar28 + 1;
                } while (plVar53 != (loop_node_t)0x0);
                if (iVar40 < 0) goto LAB_0016e1f7;
                if ((int)pgVar57 <= iVar40) {
                  pgVar57 = (gen_ctx_t)(ulong)(iVar28 + 2);
                }
              }
              lr = (live_range_t_conflict)((gen_ctx_t)lr)->to_free;
            } while ((gen_ctx_t)lr != (gen_ctx_t)0x0);
            if (-1 < (int)pgVar57) {
              if ((int)uVar41 <= (int)pgVar57) {
                pgVar57 = (gen_ctx_t)(ulong)uVar41;
              }
              unaff_R14 = (ulong)(uint)((int)unaff_R14 + (int)pgVar57 * 2);
            }
          }
          peVar46 = (pbVar6->in_edges).head;
          if (peVar46 != (in_edge_t_conflict)0x0) {
            lr = (live_range_t_conflict)gen_ctx->temp_bitmap;
            if ((gen_ctx_t)lr == (gen_ctx_t)0x0) goto LAB_0016e220;
            pgVar57 = (gen_ctx_t)0xffffffff;
            in_R8 = (gen_ctx_t)((long)((gen_ctx_t)lr)->ctx << 6);
            do {
              in_R9 = peVar46->src;
              pgVar54 = (gen_ctx_t)in_R9->index;
              if ((in_R8 <= pgVar54) ||
                 (unaff_R15 = (gen_ctx_t)((ulong)pgVar54 >> 6),
                 ((ulong)(&((gen_ctx_t)lr)->curr_func_item->data)[(long)unaff_R15] >>
                  ((ulong)pgVar54 & 0x3f) & 1) == 0)) {
                plVar53 = in_R9->loop_node;
                in_R9 = (bb_t)0xfffffffe;
                do {
                  plVar53 = plVar53->parent;
                  iVar40 = (int)in_R9;
                  uVar64 = iVar40 + 1;
                  in_R9 = (bb_t)(ulong)uVar64;
                } while (plVar53 != (loop_node_t)0x0);
                if ((int)uVar64 < 0) goto LAB_0016e1f7;
                if ((int)pgVar57 <= (int)uVar64) {
                  pgVar57 = (gen_ctx_t)(ulong)(iVar40 + 2);
                }
              }
              peVar46 = (peVar46->in_link).next;
            } while (peVar46 != (in_edge_t)0x0);
            uVar64 = (uint)pgVar57;
            if (-1 < (int)uVar64) {
              if ((int)uVar64 < (int)uVar41) {
                uVar41 = uVar64;
              }
              unaff_R14 = (ulong)((int)unaff_R14 + uVar41 * 2);
            }
          }
          plVar30 = plVar30->next;
        } while (plVar30 != (lr_bb_t)0x0);
      }
    }
    return (int)unaff_R14;
  }
LAB_0016e225:
  pcStack_40 = HTAB_lr_gap_t_do;
  gap_lr_spill_cost_cold_4();
  pVVar71 = pgVar57->tied_regs;
  pgStack_a8 = (gen_ctx_t)lr;
  pgStack_68 = unaff_RBX;
  pgStack_60 = unaff_R12;
  plStack_58 = unaff_R13;
  uStack_50 = unaff_R14;
  pgStack_48 = unaff_R15;
  pcStack_40 = (code *)unaff_RBP;
  if (pVVar71 == (bitmap_t)0x0) {
    pcStack_c8 = (code *)0x16e5b0;
    HTAB_lr_gap_t_do_cold_8();
    pgVar54 = (gen_ctx_t)lr;
    pgVar58 = pgVar57;
    pgVar57 = in_R8;
    in_R8 = unaff_R15;
LAB_0016e5b0:
    pcStack_c8 = (code *)0x16e5b5;
    HTAB_lr_gap_t_do_cold_7();
LAB_0016e5b5:
    pcStack_c8 = (code *)0x16e5ba;
    HTAB_lr_gap_t_do_cold_4();
    uVar67 = unaff_RBP;
    pgVar60 = unaff_R12;
    plVar30 = unaff_R13;
    pVVar72 = pVVar71;
LAB_0016e5ba:
    pcStack_c8 = (code *)0x16e5bf;
    HTAB_lr_gap_t_do_cold_3();
    pgVar49 = unaff_RBX;
LAB_0016e5bf:
    pcStack_c8 = (code *)0x16e5c4;
    HTAB_lr_gap_t_do_cold_5();
LAB_0016e5c4:
    pcStack_c8 = (code *)0x16e5c9;
    HTAB_lr_gap_t_do_cold_6();
    pVVar71 = pVVar72;
LAB_0016e5c9:
    pcStack_c8 = (code *)0x16e5ce;
    HTAB_lr_gap_t_do_cold_1();
  }
  else {
    pgVar54 = (gen_ctx_t)lr;
    pgVar58 = pgVar57;
    if (*(ulong **)&pgVar57->addr_insn_p == (ulong *)0x0) goto LAB_0016e5b0;
    pgStack_b0 = (gen_ctx_t)((DLIST_LINK_in_edge_t *)&pgVar57->curr_func_item)->prev;
    pgVar50 = (gen_ctx_t)pVVar71->els_num;
    pgVar60 = (gen_ctx_t)((ulong)in_RCX & 0xffffffff);
    uVar41 = (int)in_RCX - 1;
    uVar67 = (ulong)uVar41;
    pgStack_b8 = pgVar57;
    pbStack_a0 = extraout_RDX;
    if (1 < uVar41) {
LAB_0016e3d9:
      pcStack_c8 = (code *)0x16e3f0;
      pgVar58 = pgStack_a8;
      iVar40 = (*(code *)pgStack_b8->debug_file)(pgStack_a8,pbStack_a0,pgStack_b0);
      uVar64 = iVar40 + (uint)(iVar40 == 0);
      pgVar54 = (gen_ctx_t)(ulong)uVar64;
      unaff_RBX = pgVar50;
      unaff_RBP = uVar67;
      pgVar57 = pgStack_b8;
      unaff_R12 = pgVar60;
      if (pgStack_b8->tied_regs == (bitmap_t)0x0) goto LAB_0016e5b5;
      in_RCX = *(bitmap_el_t **)&pgStack_b8->addr_insn_p;
      plVar30 = unaff_R13;
      pVVar72 = pVVar71;
      uStack_8c = uVar41;
      pgStack_88 = in_R8;
      pgStack_80 = pgVar60;
      if (in_RCX != (bitmap_el_t *)0x0) {
        pbVar31 = pgStack_b8->tied_regs->varr;
        bVar8 = in_RCX[2];
        uVar67 = (ulong)((int)pgVar50 - 1);
        plStack_98 = (lr_bb_t_conflict)CONCAT44(plStack_98._4_4_,uVar64);
        pgVar57 = pgVar54;
        pgVar58 = pgStack_b8;
        puVar69 = (uint *)0x0;
        uStack_78 = uVar67;
        pbStack_70 = pbVar31;
        do {
          uVar64 = uVar64 & (uint)uVar67;
          puVar66 = (uint *)((long)pbVar31 + (ulong)uVar64 * 4);
          uVar33 = (ulong)*puVar66;
          puVar70 = puVar66;
          if (uVar33 != 0xfffffffe) {
            if (*puVar66 == 0xffffffff) {
              if (1 < uStack_8c) {
                return 0;
              }
              *(int *)&pgVar58->ctx = *(int *)&pgVar58->ctx + 1;
              uVar67 = (ulong)pgVar58->optimize_level;
              if (puVar69 != (uint *)0x0) {
                puVar66 = puVar69;
              }
              *(int *)(bVar8 + uVar67 * 0x18) = (int)pgVar57;
              *(gen_ctx_t *)(bVar8 + 8 + uVar67 * 0x18) = pgStack_a8;
              *(bb_t *)(bVar8 + 0x10 + uVar67 * 0x18) = pbStack_a0;
              uVar41 = pgVar58->optimize_level;
              pgVar58->optimize_level = uVar41 + 1;
              *puVar66 = uVar41;
              pgStack_88->ctx = (MIR_context_t)pgStack_a8;
              *(bb_t *)&pgStack_88->optimize_level = pbStack_a0;
              return 0;
            }
            puVar70 = puVar69;
            if (*(int *)(bVar8 + uVar33 * 0x18) == (int)pgVar57) {
              puVar2 = (undefined4 *)(bVar8 + uVar33 * 0x18);
              pcStack_c8 = (code *)0x16e48e;
              iVar40 = (*(code *)((DLIST_LINK_out_edge_t *)&pgStack_b8->debug_level)->prev)
                                 (*(undefined8 *)(puVar2 + 2),*(undefined8 *)(puVar2 + 4),pgStack_a8
                                  ,pbStack_a0,pgStack_b0);
              pgVar50 = pgStack_88;
              pgVar57 = (gen_ctx_t)((ulong)plStack_98 & 0xffffffff);
              uVar67 = uStack_78;
              pbVar31 = pbStack_70;
              pgVar58 = pgStack_b8;
              if (iVar40 != 0) {
                if ((int)pgStack_80 == 3) {
                  *(int *)&pgStack_b8->ctx = *(int *)&pgStack_b8->ctx + -1;
                  *puVar66 = 0xfffffffe;
                  if ((out_edge_t)pgStack_b8->to_free != (out_edge_t)0x0) {
                    pcStack_c8 = (code *)0x16e590;
                    (*(code *)pgStack_b8->to_free)
                              (*(undefined8 *)(puVar2 + 2),*(undefined8 *)(puVar2 + 4),pgStack_b0);
                  }
                  *puVar2 = 0;
                }
                else {
                  if ((int)pgStack_80 == 2) {
                    if ((out_edge_t)pgStack_b8->to_free != (out_edge_t)0x0) {
                      pcStack_c8 = (code *)0x16e54b;
                      (*(code *)pgStack_b8->to_free)
                                (*(undefined8 *)(puVar2 + 2),*(undefined8 *)(puVar2 + 4),pgStack_b0)
                      ;
                    }
                    *(gen_ctx_t *)(puVar2 + 2) = pgStack_a8;
                    *(bb_t *)(puVar2 + 4) = pbStack_a0;
                  }
                  pbVar7 = *(bb_t *)(puVar2 + 4);
                  pgVar50->ctx = *(MIR_context_t *)(puVar2 + 2);
                  *(bb_t *)&pgVar50->optimize_level = pbVar7;
                }
                return 1;
              }
            }
          }
          *(int *)&pgVar58->field_0xc = *(int *)&pgVar58->field_0xc + 1;
          pgVar54 = (gen_ctx_t)((ulong)pgVar54 >> 0xb);
          uVar64 = (int)pgVar54 + 1 + uVar64 * 5;
          puVar69 = puVar70;
        } while( true );
      }
      goto LAB_0016e5ba;
    }
    pgVar49 = (gen_ctx_t)**(ulong **)&pgVar57->addr_insn_p;
    if (pgVar57->optimize_level != (int)pgVar49) goto LAB_0016e3d9;
    pgVar58 = (gen_ctx_t)pVVar71->varr;
    pgVar54 = pgStack_b0;
    plVar30 = unaff_R13;
    pVVar72 = pVVar71;
    if (pgVar58 == (gen_ctx_t)0x0) goto LAB_0016e5c4;
    plVar30 = (lr_bb_t_conflict)(ulong)((uint)pgVar50 * 2);
    if ((lr_bb_t_conflict)pVVar71->size != plVar30) {
      pgVar54 = (gen_ctx_t)((long)plVar30 * 4);
      pcStack_c8 = (code *)0x16e2c2;
      plStack_98 = plVar30;
      pbVar31 = (bitmap_el_t *)realloc(pgVar58,(size_t)pgVar54);
      pVVar71->varr = pbVar31;
      pVVar72 = pgStack_b8->tied_regs;
      pVVar71->size = (size_t)plStack_98;
      pVVar71->els_num = (size_t)plStack_98;
      pgVar57 = pgStack_b8;
      plVar30 = plStack_98;
      pVVar71 = pVVar72;
      if (pVVar72 != (bitmap_t)0x0) goto LAB_0016e2ea;
      goto LAB_0016e5c9;
    }
    pVVar71->els_num = (size_t)plVar30;
LAB_0016e2ea:
    if ((int)plVar30 != 0) {
      pgVar58 = (gen_ctx_t)pVVar72->varr;
      pgVar54 = (gen_ctx_t)0xff;
      pcStack_c8 = (code *)0x16e307;
      memset(pgVar58,0xff,(ulong)((uint)pgVar50 & 0x7fffffff) << 3);
    }
    pVVar72 = *(bitmap_t *)&pgStack_b8->addr_insn_p;
    pgVar57 = pgStack_b8;
    if ((pVVar72 == (bitmap_t)0x0) ||
       (pgVar58 = (gen_ctx_t)pVVar72->varr, pgVar58 == (gen_ctx_t)0x0)) goto LAB_0016e5bf;
    pgVar49 = (gen_ctx_t)(ulong)(uint)((int)pgVar49 * 2);
    if ((gen_ctx_t)pVVar72->size == pgVar49) {
      pVVar72->els_num = (size_t)pgVar49;
      pVVar71 = pVVar72;
LAB_0016e368:
      in_RCX = pVVar71->varr;
      uVar64 = *(uint *)((long)&pgStack_b8->ctx + 4);
      uVar5 = pgStack_b8->optimize_level;
      *(undefined4 *)&pgStack_b8->ctx = 0;
      pgStack_b8->optimize_level = 0;
      *(undefined4 *)((long)&pgStack_b8->ctx + 4) = 0;
      if (uVar64 < uVar5) {
        iVar40 = uVar5 - uVar64;
        pVVar71 = (bitmap_t)(in_RCX + (ulong)uVar64 * 3 + 2);
        pgVar57 = pgStack_b8;
        do {
          if ((int)*(bitmap_el_t *)((long)pVVar71 + -0x10) != 0) {
            pcStack_c8 = (code *)0x16e3ae;
            el.lr = *(live_range_t_conflict *)pVVar71;
            el._0_8_ = *(bitmap_el_t *)((long)pVVar71 + -8);
            HTAB_lr_gap_t_do((HTAB_lr_gap_t *)pgVar57,el,HTAB_INSERT,(lr_gap_t *)in_R8);
            in_RCX = *(bitmap_el_t **)pVVar71;
            pcStack_c8 = (code *)0x16e3c9;
            (*(code *)((DLIST_LINK_out_edge_t *)&pgStack_b8->debug_level)->prev)
                      (in_R8->ctx,*(bb_t *)&in_R8->optimize_level,
                       *(bitmap_el_t *)((long)pVVar71 + -8),in_RCX,pgStack_b0);
            pgVar57 = pgStack_b8;
          }
          pVVar71 = (bitmap_t)((long)pVVar71 + 0x18);
          iVar40 = iVar40 + -1;
        } while (iVar40 != 0);
      }
      pgVar50 = (gen_ctx_t)((ulong)plVar30 & 0xffffffff);
      unaff_R13 = plVar30;
      goto LAB_0016e3d9;
    }
    pgVar54 = (gen_ctx_t)((long)pgVar49 * 0x18);
    pcStack_c8 = (code *)0x16e348;
    pbVar31 = (bitmap_el_t *)realloc(pgVar58,(size_t)pgVar54);
    pVVar72->varr = pbVar31;
    pVVar71 = *(bitmap_t *)&pgStack_b8->addr_insn_p;
    pVVar72->size = (size_t)pgVar49;
    pVVar72->els_num = (size_t)pgVar49;
    pgVar57 = pgStack_b8;
    if (pVVar71 != (bitmap_t)0x0) goto LAB_0016e368;
  }
  pcStack_c8 = rewrite_insn;
  HTAB_lr_gap_t_do_cold_2();
  pMVar61 = pgVar58->ctx;
  pDStack_2a0 = (DLIST_in_edge_t *)0x0;
  pcStack_370 = (code *)0x16e61a;
  pgStack_f0 = pgVar49;
  pgStack_e8 = pgVar60;
  plStack_e0 = plVar30;
  pVStack_d8 = pVVar71;
  pgStack_d0 = in_R8;
  pcStack_c8 = (code *)uVar67;
  MIR_new_int_op(pMVar61,0);
  pcStack_370 = (code *)0x16e62c;
  MIR_new_int_op(pMVar61,0);
  pcStack_370 = (code *)0x16e637;
  sStack_288 = MIR_insn_nops(pMVar61,(MIR_insn_t_conflict)pgVar54);
  pDStack_298 = (DLIST_LINK_bb_t *)&pgVar54->debug_level;
  pMStack_290 = (MIR_insn_t_conflict)((long)&((DLIST_out_edge_t *)&pgVar54->addr_regs)->head + 4);
  uVar67 = CONCAT71((int7)((ulong)pgVar60 >> 8),1);
  uStack_2ac = 0xffffffff;
  uStack_2a8 = 0xffffffff;
  do {
    if (sStack_288 != 0) {
      sVar73 = 0;
      pMVar34 = pMStack_290;
      do {
        pcStack_370 = (code *)0x16e6b0;
        MVar25 = MIR_insn_op_mode(pMVar61,(MIR_insn_t_conflict)pgVar54,sVar73,&iStack_2a4);
        iVar40 = iStack_2a4;
        if ((byte)uVar67 != 0) {
          if ((iStack_2a4 != 0) &&
             (cVar39 = *(char *)((long)&pMVar34[-1].ops[0].u + 4), cVar39 != '\v'))
          goto LAB_0016e6e9;
          goto LAB_0016eae5;
        }
        cVar39 = *(char *)((long)&pMVar34[-1].ops[0].u + 4);
        if (iStack_2a4 == 0) {
          iVar40 = 0;
        }
        else if (cVar39 != '\v') goto LAB_0016eae5;
LAB_0016e6e9:
        if (cVar39 != '\v') {
          if (cVar39 != '\x02') goto LAB_0016eae5;
          uVar41 = pMVar34[-1].ops[0].u.mem.nloc;
          uVar33 = (ulong)uVar41;
          if (uVar33 < 0x22) {
            pVVar71 = pgVar58->func_used_hard_regs;
            pcStack_370 = (code *)0x16e725;
            bitmap_expand(pVVar71,uVar33 + 1);
            if (pVVar71 != (bitmap_t)0x0) {
              *pVVar71->varr = *pVVar71->varr | 1L << (uVar33 & 0x3f);
              if (in_RCX != (bitmap_el_t *)0x0) {
                pcStack_370 = (code *)0x16e757;
                update_live(pMVar34[-1].ops[0].u.mem.nloc,iStack_2a4,(bitmap_t)in_RCX[1]);
              }
              goto LAB_0016eae5;
            }
LAB_0016fce6:
            pcStack_370 = (code *)0x16fceb;
            rewrite_insn_cold_9();
            goto LAB_0016fceb;
          }
          if (iVar40 == 0) {
            pVVar14 = pgVar58->ra_ctx->reg_renumber;
            if (((pVVar14 != (VARR_MIR_reg_t *)0x0) && (pVVar14->varr != (MIR_reg_t *)0x0)) &&
               (uVar33 < pVVar14->els_num)) {
              pDStack_2a0 = (DLIST_in_edge_t *)
                            (ulong)((int)pDStack_2a0 +
                                   (uint)(MVar25 - MIR_OP_REF < 0xfffffffd &&
                                         0x21 < pVVar14->varr[uVar33]));
              goto LAB_0016e909;
            }
LAB_0016fce1:
            pcStack_370 = (code *)0x16fce6;
            rewrite_insn_cold_8();
            goto LAB_0016fce6;
          }
LAB_0016e909:
          if (in_RCX == (bitmap_el_t *)0x0) goto LAB_0016eae5;
          pcStack_370 = (code *)0x16e91a;
          update_live(uVar41,iVar40,(bitmap_t)in_RCX[1]);
          plVar12 = (long *)in_RCX[2];
          if (plVar12 != (long *)0x0) {
            uVar41 = pMVar34[-1].ops[0].u.mem.nloc;
            uVar33 = (ulong)uVar41;
            if (((ulong)(*plVar12 << 6) <= uVar33) ||
               (uVar43 = (ulong)(uVar41 >> 6), uVar59 = *(ulong *)(plVar12[2] + uVar43 * 8),
               *(ulong *)(plVar12[2] + uVar43 * 8) = uVar59 & ~(1L << (uVar33 & 0x3f)),
               (uVar59 >> (uVar33 & 0x3f) & 1) == 0)) goto LAB_0016eae5;
            MVar27 = pMVar34[-1].ops[0].u.mem.nloc;
LAB_0016eac5:
            pgVar57 = (gen_ctx_t)&DAT_00000001;
            in_R9 = (bb_t)0x0;
            pcStack_370 = (code *)0x16eae5;
            spill_restore_reg(pgVar58,MVar27,base_reg,(MIR_insn_t)pgVar54,1,0);
            goto LAB_0016eae5;
          }
LAB_0016fcf5:
          pcStack_370 = (code *)0x16fcfa;
          rewrite_insn_cold_7();
LAB_0016fcfa:
          pcStack_370 = (code *)0x16fcff;
          rewrite_insn_cold_4();
LAB_0016fcff:
          pcStack_370 = (code *)0x16fd04;
          rewrite_insn_cold_2();
LAB_0016fd04:
          pcStack_370 = (code *)0x16fd09;
          rewrite_insn_cold_1();
          goto LAB_0016fd09;
        }
        uVar33 = (ulong)*(uint *)((long)&pMVar34[-1].ops[0].u + 0x1c);
        if (uVar33 < 0x22) {
          pVVar71 = pgVar58->func_used_hard_regs;
          pcStack_370 = (code *)0x16e788;
          bitmap_expand(pVVar71,uVar33 + 1);
          if (pVVar71 != (bitmap_t)0x0) {
            *pVVar71->varr = *pVVar71->varr | 1L << (uVar33 & 0x3f);
            goto LAB_0016e7aa;
          }
LAB_0016fceb:
          pcStack_370 = (code *)0x16fcf0;
          rewrite_insn_cold_6();
LAB_0016fcf0:
          pcStack_370 = (code *)0x16fcf5;
          rewrite_insn_cold_5();
          goto LAB_0016fcf5;
        }
LAB_0016e7aa:
        uVar33 = (ulong)*(uint *)&pMVar34->data;
        if (uVar33 < 0x22) {
          pVVar71 = pgVar58->func_used_hard_regs;
          pcStack_370 = (code *)0x16e7cd;
          bitmap_expand(pVVar71,uVar33 + 1);
          if (pVVar71 != (bitmap_t)0x0) {
            *pVVar71->varr = *pVVar71->varr | 1L << (uVar33 & 0x3f);
            goto LAB_0016e7ef;
          }
          goto LAB_0016fcf0;
        }
LAB_0016e7ef:
        uVar41 = *(uint *)((long)&pMVar34[-1].ops[0].u + 0x1c);
        uVar33 = (ulong)uVar41;
        if (uVar33 == 0xffffffff) {
          if (in_RCX != (bitmap_el_t *)0x0) goto LAB_0016ea72;
          goto LAB_0016eae5;
        }
        uVar64 = *(uint *)&pMVar34->data;
        if (0xffffffdc < uVar64 - 0x22 || uVar41 < 0x22) goto LAB_0016e9fb;
        pVVar14 = pgVar58->ra_ctx->reg_renumber;
        if (((pVVar14 == (VARR_MIR_reg_t *)0x0) ||
            (pMVar9 = pVVar14->varr, pMVar9 == (MIR_reg_t *)0x0)) || (pVVar14->els_num <= uVar33)) {
          pcStack_370 = (code *)0x16fce1;
          rewrite_insn_cold_3();
          goto LAB_0016fce1;
        }
        if (0x21 < pMVar9[uVar33]) {
          if (pVVar14->els_num <= (ulong)uVar64) goto LAB_0016fd04;
          if (pMVar9[uVar64] < 0x22) goto LAB_0016e9fb;
          if (iStack_2a4 == 0) {
            bVar74 = -1 < (int)uStack_2ac;
            uStack_2ac = (uint)sVar73;
            uVar5 = uStack_2a8;
            if (bVar74) goto LAB_0016fd66;
          }
          else {
            bVar74 = -1 < (int)uStack_2a8;
            uStack_2a8 = (uint)sVar73;
            uVar5 = uStack_2ac;
            if (bVar74) goto LAB_0016fd42;
          }
          if ((((int)uVar5 < 0) || (uVar41 != *(uint *)&pDStack_298[(ulong)uVar5 * 3 + 2].prev)) ||
             (uVar64 != *(uint *)((long)&pDStack_298[(ulong)uVar5 * 3 + 2].prev + 4))) {
            pDStack_2a0 = (DLIST_in_edge_t *)(ulong)((int)pDStack_2a0 + 2);
          }
        }
LAB_0016e9fb:
        if (in_RCX == (bitmap_el_t *)0x0) goto LAB_0016eae5;
        pcStack_370 = (code *)0x16ea0f;
        update_live(uVar41,0,(bitmap_t)in_RCX[1]);
        uVar41 = *(uint *)((long)&pMVar34[-1].ops[0].u + 0x1c);
        uVar33 = (ulong)uVar41;
        if (0x21 < uVar33) {
          plVar12 = (long *)in_RCX[2];
          if (plVar12 != (long *)0x0) {
            if ((uVar33 < (ulong)(*plVar12 << 6)) &&
               (uVar43 = (ulong)(uVar41 >> 6), uVar59 = *(ulong *)(plVar12[2] + uVar43 * 8),
               *(ulong *)(plVar12[2] + uVar43 * 8) = uVar59 & ~(1L << (uVar33 & 0x3f)),
               (uVar59 >> (uVar33 & 0x3f) & 1) != 0)) {
              pgVar57 = (gen_ctx_t)&DAT_00000001;
              in_R9 = (bb_t)0x0;
              pcStack_370 = (code *)0x16ea72;
              spill_restore_reg(pgVar58,*(MIR_reg_t *)((long)&pMVar34[-1].ops[0].u + 0x1c),base_reg,
                                (MIR_insn_t)pgVar54,1,0);
            }
            goto LAB_0016ea72;
          }
          goto LAB_0016fcff;
        }
LAB_0016ea72:
        if (*(MIR_reg_t *)&pMVar34->data != 0xffffffff) {
          pcStack_370 = (code *)0x16ea84;
          update_live(*(MIR_reg_t *)&pMVar34->data,0,(bitmap_t)in_RCX[1]);
          uVar33 = (ulong)*(uint *)&pMVar34->data;
          if (uVar33 < 0x22) goto LAB_0016eae5;
          plVar12 = (long *)in_RCX[2];
          if (plVar12 != (long *)0x0) {
            if ((uVar33 < (ulong)(*plVar12 << 6)) &&
               (uVar43 = (ulong)(*(uint *)&pMVar34->data >> 6),
               uVar59 = *(ulong *)(plVar12[2] + uVar43 * 8),
               *(ulong *)(plVar12[2] + uVar43 * 8) = uVar59 & ~(1L << (uVar33 & 0x3f)),
               (uVar59 >> (uVar33 & 0x3f) & 1) != 0)) {
              MVar27 = *(MIR_reg_t *)&pMVar34->data;
              goto LAB_0016eac5;
            }
            goto LAB_0016eae5;
          }
          goto LAB_0016fcfa;
        }
LAB_0016eae5:
        sVar73 = sVar73 + 1;
        pMVar34 = (MIR_insn_t_conflict)&pMVar34->ops[0].u;
      } while (sStack_288 != sVar73);
    }
    if ((~(byte)uVar67 & 1) == 0 && in_RCX != (bitmap_el_t *)0x0) {
      pcStack_370 = (code *)0x16eb29;
      target_get_early_clobbered_hard_regs
                ((MIR_insn_t)pgVar54->debug_file,(MIR_reg_t *)&MStack_218,(MIR_reg_t *)&MStack_248);
      if ((MIR_reg_t)MStack_218.data != 0xffffffff) {
        pcStack_370 = (code *)0x16eb43;
        update_live((MIR_reg_t)MStack_218.data,1,(bitmap_t)in_RCX[1]);
      }
      if ((MIR_reg_t)MStack_248.data != 0xffffffff) {
        pcStack_370 = (code *)0x16eb5d;
        update_live((MIR_reg_t)MStack_248.data,1,(bitmap_t)in_RCX[1]);
      }
      if (0xfffffffc < *(int *)&pgVar54->debug_file - 0xaaU) {
        pVVar71 = pgVar58->call_used_hard_regs[0x12];
        if (pVVar71 == (bitmap_t)0x0) goto LAB_0016fd3d;
        pMVar62 = pgVar54->ctx;
        uVar33 = pVVar71->els_num;
        if (uVar33 != 0) {
          uVar43 = 0;
          uVar59 = 0;
          do {
            while ((pVVar71->varr[uVar43] == 0 ||
                   (uVar55 = pVVar71->varr[uVar43] >> (uVar59 & 0x3f), uVar55 == 0))) {
              uVar43 = uVar43 + 1;
              uVar59 = uVar43 * 0x40;
              if (uVar33 == uVar43) goto LAB_0016ebfd;
            }
            uVar33 = uVar55 & 1;
            uVar43 = uVar59;
            while (uVar33 == 0) {
              uVar43 = uVar43 + 1;
              uVar33 = uVar55 & 2;
              uVar55 = uVar55 >> 1;
            }
            uVar59 = uVar43 + 1;
            pcStack_370 = (code *)0x16ebee;
            update_live((MIR_reg_t)uVar43,1,(bitmap_t)in_RCX[1]);
            uVar33 = pVVar71->els_num;
            uVar43 = uVar59 >> 6;
          } while (uVar43 < uVar33);
        }
LAB_0016ebfd:
        pHVar10 = pMVar62->module_item_tab;
        if (pHVar10 != (HTAB_MIR_item_t *)0x0) {
          uVar33._0_4_ = pHVar10->els_num;
          uVar33._4_4_ = pHVar10->els_start;
          if (uVar33 != 0) {
            uVar43 = 0;
            uVar59 = 0;
            do {
              while ((uVar55 = *(ulong *)((long)pHVar10->arg + uVar43 * 8), uVar55 == 0 ||
                     (uVar55 = uVar55 >> (uVar59 & 0x3f), uVar55 == 0))) {
                uVar43 = uVar43 + 1;
                uVar59 = uVar43 * 0x40;
                if (uVar33 == uVar43) goto LAB_0016ec80;
              }
              uVar33 = uVar55 & 1;
              uVar43 = uVar59;
              while (uVar33 == 0) {
                uVar43 = uVar43 + 1;
                uVar33 = uVar55 & 2;
                uVar55 = uVar55 >> 1;
              }
              uVar59 = uVar43 + 1;
              pcStack_370 = (code *)0x16ec71;
              update_live((MIR_reg_t)uVar43,0,(bitmap_t)in_RCX[1]);
              uVar33._0_4_ = pHVar10->els_num;
              uVar33._4_4_ = pHVar10->els_start;
              uVar43 = uVar59 >> 6;
            } while (uVar43 < uVar33);
          }
LAB_0016ec80:
          puVar11 = (ulong *)in_RCX[1];
          if (puVar11 != (ulong *)0x0) {
            uVar33 = *puVar11;
            if (uVar33 != 0) {
              uVar43 = 0;
              uVar59 = 0;
              do {
                while ((uVar55 = *(ulong *)(puVar11[2] + uVar43 * 8), uVar55 == 0 ||
                       (uVar55 = uVar55 >> (uVar59 & 0x3f), uVar55 == 0))) {
                  uVar43 = uVar43 + 1;
                  uVar59 = uVar43 * 0x40;
                  if (uVar33 == uVar43) goto LAB_0016ee44;
                }
                uVar33 = uVar55 & 1;
                while (uVar33 == 0) {
                  uVar59 = uVar59 + 1;
                  uVar33 = uVar55 & 2;
                  uVar55 = uVar55 >> 1;
                }
                if (uVar59 < 0x22) goto LAB_0016ee26;
                plVar12 = *(long **)(*in_RCX + 0x78);
                if (plVar12 == (long *)0x0) {
                  pcStack_370 = (code *)0x16fdc8;
                  rewrite_insn_cold_13();
                  goto LAB_0016fdc8;
                }
                uVar33 = uVar59 & 0xffffffff;
                uVar41 = (uint)uVar59;
                if (((ulong)(*plVar12 << 6) <= uVar33) ||
                   ((*(ulong *)(plVar12[2] + (uVar33 >> 6) * 8) >> (uVar59 & 0x3f) & 1) == 0)) {
                  pVVar14 = pgVar58->ra_ctx->reg_renumber;
                  if ((pVVar14 == (VARR_MIR_reg_t *)0x0) ||
                     ((pVVar14->varr == (MIR_reg_t *)0x0 || (pVVar14->els_num <= uVar33)))) {
                    pcStack_370 = (code *)0x16fd66;
                    rewrite_insn_cold_12();
LAB_0016fd66:
                    pcStack_370 = (code *)0x16fd85;
                    __assert_fail("in_mem_op_num < 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                  ,0x1f5f,
                                  "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                 );
                  }
                  pMVar44 = (MIR_insn_t)(ulong)pVVar14->varr[uVar33];
                  if (pMVar44 < (MIR_insn_t)0x22) {
                    pcStack_370 = (code *)0x16ed85;
                    pMStack_280 = pMVar44;
                    MIR_reg_type(pgVar58->ctx,uVar41 - 0x21,(pgVar58->curr_func_item->u).func);
                    pVVar71 = pgVar58->call_used_hard_regs[0x12];
                    if (pVVar71 == (bitmap_t)0x0) {
                      pcStack_370 = (code *)0x16fdfe;
                      rewrite_insn_cold_11();
                      goto LAB_0016fdfe;
                    }
                    pMVar44 = (MIR_insn_t)(pVVar71->els_num << 6);
                    if ((pMStack_280 < pMVar44) &&
                       ((*pVVar71->varr >> ((ulong)pMStack_280 & 0x3f) & 1) != 0)) {
                      pgVar50 = (gen_ctx_t)in_RCX[2];
                      sVar73 = uVar33 + 1;
                      pcStack_370 = (code *)0x16edce;
                      pgVar60 = pgVar50;
                      bitmap_expand((bitmap_t)pgVar50,sVar73);
                      iVar40 = (int)pgVar57;
                      iVar28 = (int)in_R9;
                      if (pgVar50 == (gen_ctx_t)0x0) {
                        pcStack_370 = spill_restore_reg;
                        rewrite_insn_cold_10();
                        pMVar61 = pgVar60->ctx;
                        MVar27 = (int)sVar73 - 0x21;
                        puStack_398 = puVar11;
                        uStack_390 = uVar67;
                        pbStack_388 = in_RCX;
                        uStack_380 = uVar59;
                        pgStack_378 = pgVar50;
                        pcStack_370 = (code *)uVar33;
                        MVar26 = MIR_reg_type(pMVar61,MVar27,(pgVar60->curr_func_item->u).func);
                        if (MVar26 == MIR_T_F) {
                          MVar25 = MIR_OP_FLOAT;
                        }
                        else if (MVar26 == MIR_T_D) {
                          MVar25 = MIR_OP_DOUBLE;
                        }
                        else {
                          MVar25 = (uint)(MVar26 == MIR_T_LD) * 4 + MIR_OP_INT;
                        }
                        prVar32 = pgVar60->ra_ctx;
                        pVVar14 = prVar32->reg_renumber;
                        if (((pVVar14 == (VARR_MIR_reg_t *)0x0) ||
                            (pVVar14->varr == (MIR_reg_t *)0x0)) ||
                           (uVar67 = sVar73 & 0xffffffff, pVVar14->els_num <= uVar67))
                        goto LAB_0017022a;
                        uVar41 = pVVar14->varr[uVar67];
                        if (0x21 < uVar41) goto LAB_00170258;
                        pVVar56 = prVar32->used_locs;
                        if (pVVar56 == (VARR_bitmap_t *)0x0) {
                          spill_restore_reg_cold_6();
LAB_0017027c:
                          spill_restore_reg_cold_5();
                        }
                        else {
                          pVVar15 = prVar32->spill_cache;
                          if (pVVar15 == (VARR_spill_cache_el_t *)0x0) goto LAB_0017027c;
                          if (((int)sVar73 == -1) || (pVVar15->els_num <= uVar67))
                          goto LAB_0017022f;
                          psVar16 = pVVar15->varr;
                          if (psVar16[uVar67].age == prVar32->spill_cache_age) {
                            MStack_418 = psVar16[uVar67].slot;
                            goto LAB_0017019a;
                          }
                          pVVar71 = prVar32->conflict_locs1;
                          if ((pVVar71 != (bitmap_t)0x0) && (pVVar71->varr != (bitmap_el_t *)0x0)) {
                            ppVVar17 = pVVar56->varr;
                            pMVar61 = pgVar60->ctx;
                            pVVar71->els_num = 0;
                            pVVar18 = pgVar60->lr_ctx->var_live_ranges;
                            if ((pVVar18 == (VARR_live_range_t *)0x0) ||
                               ((pVVar18->varr == (live_range_t_conflict *)0x0 ||
                                (pVVar18->els_num <= uVar67)))) {
                              spill_restore_reg_cold_3();
                            }
                            else {
                              for (plVar37 = pVVar18->varr[uVar67];
                                  plVar37 != (live_range_t_conflict)0x0; plVar37 = plVar37->next) {
                                if (plVar37->start <= plVar37->finish) {
                                  lVar45 = (long)plVar37->start + -1;
                                  do {
                                    bitmap_ior(pVVar71,pVVar71,ppVVar17[lVar45 + 1]);
                                    lVar45 = lVar45 + 1;
                                  } while (lVar45 < plVar37->finish);
                                }
                              }
                              MVar26 = MIR_reg_type(pMVar61,MVar27,(pgVar60->curr_func_item->u).func
                                                   );
                              MStack_418 = get_stack_loc(pgVar60,pgVar60->ra_ctx->start_mem_loc,
                                                         MVar26,pVVar71,(int *)&MStack_3d0);
                              psVar16[uVar67].slot = MStack_418;
                              psVar16[uVar67].age = pgVar60->ra_ctx->spill_cache_age;
                              pVVar18 = pgVar60->lr_ctx->var_live_ranges;
                              if (((pVVar18 != (VARR_live_range_t *)0x0) &&
                                  (pVVar18->varr != (live_range_t_conflict *)0x0)) &&
                                 (uVar67 < pVVar18->els_num)) {
                                plVar37 = pVVar18->varr[uVar67];
                                if (plVar37 != (live_range_t_conflict)0x0) {
                                  do {
                                    iVar29 = plVar37->finish;
                                    lVar45 = (long)plVar37->start;
                                    if (plVar37->start <= iVar29) {
                                      do {
                                        uVar67 = (ulong)(uint)MStack_3d0.data;
                                        MVar27 = MStack_418;
                                        if (0 < (int)(uint)MStack_3d0.data) {
                                          do {
                                            pVVar71 = ppVVar17[lVar45];
                                            bitmap_expand(pVVar71,(ulong)MVar27 + 1);
                                            if (pVVar71 == (bitmap_t)0x0) {
                                              spill_restore_reg_cold_1();
                                              goto LAB_0017022a;
                                            }
                                            pVVar71->varr[MVar27 >> 6] =
                                                 pVVar71->varr[MVar27 >> 6] |
                                                 1L << ((ulong)MVar27 & 0x3f);
                                            MVar27 = MVar27 + 1;
                                            uVar67 = uVar67 - 1;
                                          } while (uVar67 != 0);
                                          iVar29 = plVar37->finish;
                                        }
                                        bVar74 = lVar45 < iVar29;
                                        lVar45 = lVar45 + 1;
                                      } while (bVar74);
                                    }
                                    plVar37 = plVar37->next;
                                  } while (plVar37 != (live_range_t)0x0);
                                }
LAB_0017019a:
                                if (((FILE *)pgVar60->debug_file != (FILE *)0x0) &&
                                   (1 < pgVar60->debug_level)) {
                                  pcVar48 = "Restore";
                                  if (iVar28 == 0) {
                                    pcVar48 = "Spill";
                                  }
                                  fprintf((FILE *)pgVar60->debug_file,"    %s r%d:",pcVar48,sVar73);
                                }
                                MVar27 = add_ld_st(pgVar60,&MStack_3d0,MStack_418,base_reg_00,MVar25
                                                   ,uVar41,(uint)(iVar28 == 0),10,pMVar44,iVar40);
                                return MVar27;
                              }
                            }
                            spill_restore_reg_cold_2();
LAB_00170258:
                            __assert_fail("hard_reg <= ST1_HARD_REG",
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                          ,0x1eb0,
                                          "void spill_restore_reg(gen_ctx_t, MIR_reg_t, MIR_reg_t, MIR_insn_t, int, int)"
                                         );
                          }
                        }
                        iVar28 = (int)pVVar56;
                        iVar40 = (int)sVar73;
                        spill_restore_reg_cold_4();
                        p_Var52 = (MIR_error_func_t)((ulong)pMVar61 & 0xffffffff);
                        if (iVar28 == 0) {
                          nb = p_Var52 + 1;
                          pMVar62 = bm;
                          bitmap_expand((bitmap_t)bm,(size_t)nb);
                          iVar28 = (int)nb;
                          if (bm != (MIR_context_t)0x0) {
                            p_Var38 = bm->error_func;
                            *(ulong *)(p_Var38 + ((ulong)p_Var52 >> 6) * 8) =
                                 *(ulong *)(p_Var38 + ((ulong)p_Var52 >> 6) * 8) |
                                 1L << ((ulong)pMVar61 & 0x3f);
                            goto LAB_001702e7;
                          }
                        }
                        else {
                          if (bm != (MIR_context_t)0x0) {
                            p_Var38 = (MIR_error_func_t)((long)bm->gen_ctx << 6);
                            if (p_Var52 < p_Var38) {
                              p_Var38 = bm->error_func;
                              bVar4 = (byte)p_Var52 & 0x3f;
                              *(ulong *)(p_Var38 + ((ulong)p_Var52 >> 6) * 8) =
                                   *(ulong *)(p_Var38 + ((ulong)p_Var52 >> 6) * 8) &
                                   (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                            }
LAB_001702e7:
                            return (int)p_Var38;
                          }
                          update_live_cold_1();
                          pMVar62 = pMVar61;
                        }
                        update_live_cold_2();
                        pvVar13 = pMVar62[1].environment_module.data;
                        lVar45 = 0x1e8;
                        uVar67 = (ulong)(iVar40 != 0);
                        if (iVar40 == 0) {
                          lVar45 = 0x188;
                        }
                        iVar40 = *(int *)((long)pvVar13 + uVar67 * 4 + 0x180);
                        lVar63 = (long)iVar40;
                        if (lVar63 < 1) {
                          uVar64 = 0;
                          goto LAB_001703e4;
                        }
                        uVar41 = extraout_EDX - 8;
                        lVar65 = 0;
                        uVar64 = 0;
                        goto LAB_00170360;
                      }
                      pvVar13 = (&pgVar50->curr_func_item->data)[uVar41 >> 6];
                      (&pgVar50->curr_func_item->data)[uVar41 >> 6] =
                           (void *)((ulong)pvVar13 | 1L << (uVar59 & 0x3f));
                      if (((ulong)pvVar13 >> (uVar59 & 0x3f) & 1) == 0) {
                        pgVar57 = (gen_ctx_t)&DAT_00000001;
                        in_R9 = (bb_t)&DAT_00000001;
                        pcStack_370 = (code *)0x16ee26;
                        spill_restore_reg(pgVar58,uVar41,base_reg,(MIR_insn_t)pgVar54,1,1);
                      }
                    }
                  }
                }
LAB_0016ee26:
                uVar33 = *puVar11;
                uVar59 = uVar59 + 1;
                uVar43 = uVar59 >> 6;
              } while (uVar43 < uVar33);
            }
            goto LAB_0016ee44;
          }
          pcStack_370 = (code *)0x16fd38;
          rewrite_insn_cold_14();
        }
        pcStack_370 = (code *)0x16fd3d;
        rewrite_insn_cold_15();
LAB_0016fd3d:
        pcStack_370 = (code *)0x16fd42;
        rewrite_insn_cold_16();
LAB_0016fd42:
        pcStack_370 = (code *)0x16fd61;
        __assert_fail("out_mem_op_num < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f5b,
                      "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)");
      }
    }
LAB_0016ee44:
    uVar33 = uVar67 & 1;
    uVar67 = 0;
  } while (uVar33 != 0);
  prVar32 = pgVar58->ra_ctx;
  prVar32->in_reloads_num = 0;
  prVar32->out_reloads_num = 0;
  if ((int)(MIR_reg_t)pDStack_2a0 < 3) {
LAB_0016f25c:
    pFVar51 = pgVar54->debug_file;
    if (0xfffffffb < (int)pFVar51 - 0x22U) {
      if (*(char *)&pgVar54->temp_bitmap2 != '\x02') {
        pcStack_370 = (code *)0x16fe3c;
        __assert_fail("insn->ops[1].mode == MIR_OP_VAR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f04,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar41 = *(uint *)&pgVar54->temp_bitmap3;
      if (0xffffffdc < uVar41 - 0x22) {
        pcStack_370 = (code *)0x16fe5b;
        __assert_fail("reg > ST1_HARD_REG && reg != (4294967295U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f06,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      pVVar14 = pgVar58->ra_ctx->reg_renumber;
      if (((pVVar14 == (VARR_MIR_reg_t *)0x0) || (pVVar14->varr == (MIR_reg_t *)0x0)) ||
         (pVVar14->els_num <= (ulong)uVar41)) goto LAB_0016fdd2;
      uVar64 = pVVar14->varr[uVar41];
      pMVar62 = pgVar58->ctx;
      pcStack_370 = (code *)0x16f2c9;
      MVar26 = MIR_reg_type(pMVar62,uVar41 - 0x21,(pgVar58->curr_func_item->u).func);
      if (uVar64 < 0x22) {
        pcStack_370 = (code *)0x16fe7a;
        __assert_fail("loc > ST1_HARD_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f09,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar64 = uVar64 - 0x22;
      if (pgVar58->target_ctx->keep_fp_p == '\0') {
        lVar45 = (ulong)uVar64 << 3;
      }
      else {
        lVar45 = -0xb0;
        if (((pgVar58->curr_func_item->u).func)->vararg_p == '\0') {
          lVar45 = 0;
        }
        lVar45 = lVar45 + (ulong)((MVar26 == MIR_T_LD) + 1 + uVar64) * -8;
      }
      pcStack_370 = (code *)0x16f32b;
      MVar27 = get_reload_hreg(pgVar58,0xffffffff,6,0);
      pcStack_370 = (code *)0x16f345;
      _MIR_new_var_op(pMVar62,MVar27);
      pcStack_370 = (code *)0x16f350;
      iVar35 = _MIR_addr_offset(pMVar62,*(MIR_insn_code_t *)&pgVar54->debug_file);
      pcStack_370 = (code *)0x16f369;
      MIR_new_int_op(pMVar62,lVar45 + iVar35);
      pcStack_370 = (code *)0x16f3a5;
      pMStack_290 = MIR_new_insn(pMVar62,MIR_MOV);
      pcStack_370 = (code *)0x16f3c2;
      _MIR_new_var_op(pMVar62,MVar27);
      pDStack_2a0 = (DLIST_in_edge_t *)CONCAT44(pDStack_2a0._4_4_,MVar27);
      pcStack_370 = (code *)0x16f3de;
      _MIR_new_var_op(pMVar62,MVar27);
      pcStack_370 = (code *)0x16f3f8;
      _MIR_new_var_op(pMVar62,base_reg);
      pMVar34 = pMStack_290;
      pcStack_370 = (code *)0x16f45e;
      insn = MIR_new_insn(pMVar62,MIR_ADD);
      if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
        if (pgVar58->optimize_level == 0) {
          uVar41 = *(int *)&pgVar54->debug_file - 0xa7;
          pgVar57 = pgVar54;
          if ((uVar41 < 0xe) && ((0x2007U >> (uVar41 & 0x1f) & 1) != 0)) {
            pgVar57 = (gen_ctx_t)pgVar54->ctx;
          }
        }
        else {
          pgVar57 = (gen_ctx_t)&pgVar54->ctx->temp_string;
        }
        pcStack_370 = (code *)0x16f4c2;
        fprintf((FILE *)pgVar58->debug_file,"    Adding before insn (in BB %lu) ",
                pgVar57->ctx->gen_ctx);
        pcStack_370 = (code *)0x16f4e6;
        MIR_output_insn(pMVar62,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar54,
                        (pgVar58->curr_func_item->u).func,0);
        pcStack_370 = (code *)0x16f501;
        fwrite(":\n      ",8,1,(FILE *)pgVar58->debug_file);
        pcStack_370 = (code *)0x16f520;
        MIR_output_insn(pMVar62,pgVar58->debug_file,pMVar34,(pgVar58->curr_func_item->u).func,1);
        pcStack_370 = (code *)0x16f53b;
        fwrite("      ",6,1,(FILE *)pgVar58->debug_file);
        pcStack_370 = (code *)0x16f55a;
        MIR_output_insn(pMVar62,pgVar58->debug_file,insn,(pgVar58->curr_func_item->u).func,1);
      }
      pcStack_370 = (code *)0x16f56c;
      gen_add_insn_before(pgVar58,(MIR_insn_t)pgVar54,pMVar34);
      pcStack_370 = (code *)0x16f57a;
      gen_add_insn_before(pgVar58,(MIR_insn_t)pgVar54,insn);
      if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
        pcStack_370 = (code *)0x16f5a4;
        fwrite("Changing ",9,1,(FILE *)pgVar58->debug_file);
        pcStack_370 = (code *)0x16f5be;
        MIR_output_insn(pMVar62,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar54,
                        (pgVar58->curr_func_item->u).func,0);
      }
      *(undefined4 *)&pgVar54->debug_file = 0;
      pcStack_370 = (code *)0x16f5df;
      _MIR_new_var_op(pMVar62,(MIR_reg_t)pDStack_2a0);
      auVar3._16_16_ = auStack_148;
      auVar3._0_16_ = auStack_158;
      pgVar54->temp_bitmap3 = (bitmap_t)auStack_148._0_8_;
      pgVar54->call_used_hard_regs[0] = (bitmap_t)auStack_148._8_8_;
      pgVar54->call_used_hard_regs[1] = (bitmap_t)auStack_138._0_8_;
      pgVar54->call_used_hard_regs[2] = (bitmap_t)auStack_138._8_8_;
      *(undefined1 (*) [32])&pgVar54->temp_bitmap = auVar3;
      if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
        pcStack_370 = (code *)0x16f61c;
        fwrite(" to ",4,1,(FILE *)pgVar58->debug_file);
        pcStack_370 = (code *)0x16f639;
        MIR_output_insn(pMVar62,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar54,
                        (pgVar58->curr_func_item->u).func,1);
      }
      pFVar51 = pgVar54->debug_file;
    }
    if (sStack_288 != 0) {
      pDStack_2a0 = (DLIST_in_edge_t *)&pgVar54->addr_insn_p;
      pMVar34 = (MIR_insn_t_conflict)(ulong)((int)pFVar51 - 0xaa);
      sVar73 = 0;
      pMStack_290 = pMVar34;
      do {
        pDVar68 = pDStack_298 + sVar73 * 3;
        pcStack_370 = (code *)0x16f69f;
        MVar25 = MIR_insn_op_mode(pMVar61,(MIR_insn_t_conflict)pgVar54,sVar73,&iStack_2a4);
        if ((pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
          auVar3 = *(undefined1 (*) [32])pDVar68;
          pauVar36 = (undefined1 (*) [32])&pbStack_1e8;
          if (iStack_2a4 == 0) {
            pauVar36 = (undefined1 (*) [32])&pbStack_1b8;
          }
          *(undefined1 (*) [32])(*pauVar36 + 0x10) = *(undefined1 (*) [32])(pDVar68 + 1);
          *pauVar36 = auVar3;
        }
        if (*(char *)&pDVar68->next == '\v') {
          if (((uint)pMVar34 < 0xfffffffd) ||
             (*(byte *)&((DLIST_in_edge_t *)(pDVar68 + 1))->head - 0x11 < 0xfffffffb)) {
            if (0x22 < *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar68 + 2))->head + 1) {
              pcStack_370 = (code *)0x16f7dc;
              MVar27 = change_reg(pgVar58,&MStack_278,
                                  *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar68 + 2))->head,base_reg,
                                  MIR_OP_INT,(MIR_insn_t)pgVar54,0);
              *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar68 + 2))->head = MVar27;
              if (MVar27 == 0xffffffff) {
                pcStack_370 = (code *)0x16fda4;
                __assert_fail("op->u.var_mem.base != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fcc,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
            MVar27 = *(MIR_reg_t *)((long)&((DLIST_out_edge_t *)(pDVar68 + 2))->head + 4);
            if (0x22 < MVar27 + 1) {
              pcStack_370 = (code *)0x16f82f;
              MVar27 = change_reg(pgVar58,&MStack_278,MVar27,base_reg,MIR_OP_INT,(MIR_insn_t)pgVar54
                                  ,0);
              *(MIR_reg_t *)((long)&((DLIST_out_edge_t *)(pDVar68 + 2))->head + 4) = MVar27;
              if (MVar27 == 0xffffffff) {
                pcStack_370 = (code *)0x16fdc3;
                __assert_fail("op->u.var_mem.index != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fd1,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
          }
        }
        else if ((*(char *)&pDVar68->next == '\x02') &&
                (0x21 < *(uint *)&((DLIST_in_edge_t *)(pDVar68 + 1))->head)) {
          if (MVar25 == MIR_OP_VAR) {
            if ((*(int *)&pgVar54->debug_file != 0xb9) &&
               ((sVar73 != 1 || (3 < *(int *)&pgVar54->debug_file - 0x1eU)))) goto LAB_0016fdd7;
            pcStack_370 = (code *)0x16f767;
            MVar26 = MIR_reg_type(pMVar61,*(uint *)&((DLIST_in_edge_t *)(pDVar68 + 1))->head - 0x21,
                                  (pgVar58->curr_func_item->u).func);
            if (MVar26 == MIR_T_F) {
              MVar25 = MIR_OP_FLOAT;
            }
            else if (MVar26 == MIR_T_D) {
              MVar25 = MIR_OP_DOUBLE;
            }
            else {
              MVar25 = (uint)(MVar26 == MIR_T_LD) * 4 + MIR_OP_INT;
            }
          }
          pVVar14 = pgVar58->ra_ctx->reg_renumber;
          if (((pVVar14 == (VARR_MIR_reg_t *)0x0) || (pVVar14->varr == (MIR_reg_t *)0x0)) ||
             (pVVar14->els_num <= (ulong)*(uint *)&((DLIST_in_edge_t *)(pDVar68 + 1))->head)) {
LAB_0016fd09:
            pcStack_370 = (code *)0x16fd11;
            rewrite_insn_cold_18();
LAB_0016fd11:
            pcStack_370 = (code *)0x16fd33;
            __assert_fail("n < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1ef5,
                          "int try_spilled_reg_mem(gen_ctx_t, MIR_insn_t, int, MIR_reg_t, MIR_reg_t)"
                         );
          }
          if (((sVar73 == 0) && (*(int *)&pgVar54->debug_file - 0x22U < 0xfffffffc)) &&
             (uVar41 = pVVar14->varr[*(uint *)&((DLIST_in_edge_t *)(pDVar68 + 1))->head],
             0x21 < uVar41)) {
            pMVar62 = pgVar58->ctx;
            pcStack_370 = (code *)0x16f8ea;
            MVar26 = MIR_reg_type(pMVar62,*(int *)&pDStack_2a0->head - 0x21,
                                  (pgVar58->curr_func_item->u).func);
            uVar41 = uVar41 - 0x22;
            if (pgVar58->target_ctx->keep_fp_p == '\0') {
              disp = (ulong)uVar41 << 3;
            }
            else {
              lVar45 = -0xb0;
              if (((pgVar58->curr_func_item->u).func)->vararg_p == '\0') {
                lVar45 = 0;
              }
              disp = lVar45 + (ulong)((MVar26 == MIR_T_LD) + 1 + uVar41) * -8;
            }
            auVar3 = *(undefined1 (*) [32])pDStack_298;
            iVar40 = *(int *)&((DLIST_in_edge_t *)&pgVar54->addr_insn_p)->head;
            MStack_218.u._16_8_ = SUB328(*(undefined1 (*) [32])(pDStack_298 + 1),0x10);
            MStack_218.u.mem.disp = SUB328(*(undefined1 (*) [32])(pDStack_298 + 1),0x18);
            MStack_218.data._0_4_ = auVar3._0_4_;
            MStack_218.data._4_4_ = auVar3._4_4_;
            MStack_218._8_8_ = auVar3._8_8_;
            MStack_218.u.i = auVar3._16_8_;
            MStack_218.u.str.s = auVar3._24_8_;
            pcStack_370 = (code *)0x16f98d;
            _MIR_new_var_mem_op(&MStack_248,pMVar62,MVar26,disp,base_reg,0xffffffff,'\0');
            pMVar34 = pMStack_290;
            pFVar51 = pgVar54->debug_file;
            if ((int)((ulong)pFVar51 >> 0x20) < 1) {
              pcStack_370 = (code *)0x16fa3c;
              iVar40 = find_insn_pattern(pgVar58,(MIR_insn_t)pgVar54,(int *)0x0);
              pMVar34 = pMStack_290;
              if (iVar40 < 0) goto LAB_0016faa5;
            }
            else {
              uVar67 = 0;
              uVar41 = 0;
              pDVar47 = pDStack_2a0;
              do {
                if ((*(char *)&((DLIST_LINK_bb_t *)(pDVar47 + -1))->next == '\x02') &&
                   (*(int *)&pDVar47->head == iVar40)) {
                  auVar21._4_4_ = MStack_248.data._4_4_;
                  auVar21._0_4_ = (MIR_reg_t)MStack_248.data;
                  auVar21._8_8_ = MStack_248._8_8_;
                  auVar21._16_8_ = MStack_248.u.i;
                  auVar21._24_8_ = MStack_248.u.str.s;
                  auVar22._8_8_ = MStack_248.u.str.s;
                  auVar22._0_8_ = MStack_248.u.i;
                  auVar22._16_8_ = MStack_248.u._16_8_;
                  auVar22._24_8_ = MStack_248.u.mem.disp;
                  *(undefined1 (*) [32])pDVar47 = auVar22;
                  *(undefined1 (*) [32])(pDVar47 + -1) = auVar21;
                  if (1 < (int)uVar41) goto LAB_0016fd11;
                  lVar45 = (long)(int)uVar41;
                  uVar41 = uVar41 + 1;
                  aiStack_188[lVar45] = (int)uVar67;
                }
                uVar67 = uVar67 + 1;
                pDVar47 = pDVar47 + 3;
              } while ((ulong)pFVar51 >> 0x20 != uVar67);
              pcStack_370 = (code *)0x16fa19;
              iVar40 = find_insn_pattern(pgVar58,(MIR_insn_t)pgVar54,(int *)0x0);
              if (iVar40 < 0) {
                if (0 < (int)uVar41) {
                  uVar67 = 0;
                  do {
                    iVar40 = aiStack_188[uVar67];
                    auVar23._4_4_ = MStack_218.data._4_4_;
                    auVar23._0_4_ = (MIR_reg_t)MStack_218.data;
                    auVar23._8_8_ = MStack_218._8_8_;
                    auVar23._16_8_ = MStack_218.u.i;
                    auVar23._24_8_ = MStack_218.u.str.s;
                    auVar24._8_8_ = MStack_218.u.str.s;
                    auVar24._0_8_ = MStack_218.u.i;
                    auVar24._16_8_ = MStack_218.u._16_8_;
                    auVar24._24_8_ = MStack_218.u.mem.disp;
                    uVar67 = uVar67 + 1;
                    *(undefined1 (*) [32])(pDStack_298 + (long)iVar40 * 3 + 1) = auVar24;
                    *(undefined1 (*) [32])(pDStack_298 + (long)iVar40 * 3) = auVar23;
                  } while (uVar41 != uVar67);
                }
                goto LAB_0016faa5;
              }
            }
          }
          else {
LAB_0016faa5:
            pcStack_370 = (code *)0x16fade;
            MVar27 = change_reg(pgVar58,&MStack_278,
                                *(MIR_reg_t *)&((DLIST_in_edge_t *)(pDVar68 + 1))->head,base_reg,
                                MVar25,(MIR_insn_t)pgVar54,iStack_2a4);
            if (MVar27 == 0xffffffff) {
              auVar19._8_8_ = MStack_278._8_8_;
              auVar19._0_8_ = MStack_278.data;
              auVar19._16_8_ = MStack_278.u.i;
              auVar19._24_8_ = MStack_278.u.str.s;
              auVar20._8_8_ = MStack_278.u.str.s;
              auVar20._0_8_ = MStack_278.u.i;
              auVar20._16_8_ = MStack_278.u._16_8_;
              auVar20._24_8_ = MStack_278.u.mem.disp;
              *(undefined1 (*) [32])(pDVar68 + 1) = auVar20;
              *(undefined1 (*) [32])pDVar68 = auVar19;
            }
            else {
              *(MIR_reg_t *)&((DLIST_in_edge_t *)(pDVar68 + 1))->head = MVar27;
            }
          }
        }
        sVar73 = sVar73 + 1;
      } while (sVar73 != sStack_288);
      pFVar51 = pgVar54->debug_file;
    }
    pDVar68 = pDStack_298;
    iVar40 = 0;
    if (((ulong)pFVar51 & 0xfffffffc) == 0) {
      pcStack_370 = (code *)0x16fb85;
      op1_00._12_4_ = (int)((ulong)pDStack_298->next >> 0x20);
      op1_00._0_12_ = *(undefined1 (*) [12])pDStack_298;
      op1_00.u.i = (int64_t)((DLIST_in_edge_t *)(pDStack_298 + 1))->head;
      op1_00.u.mem.nonalias = (int)((DLIST_in_edge_t *)(pDStack_298 + 1))->tail;
      op1_00.u.mem.nloc = (int)((ulong)((DLIST_in_edge_t *)(pDStack_298 + 1))->tail >> 0x20);
      op1_00.u._16_8_ = ((DLIST_out_edge_t *)(pDStack_298 + 2))->head;
      op1_00.u.mem.disp = (MIR_disp_t)((DLIST_out_edge_t *)(pDStack_298 + 2))->tail;
      iVar28 = MIR_op_eq_p(pMVar61,op1_00,*(MIR_op_t *)&pgVar54->temp_bitmap);
      iVar40 = 0;
      if (iVar28 != 0) {
        if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
          pcStack_370 = (code *)0x16fbc7;
          fwrite("Deleting noop move ",0x13,1,(FILE *)pgVar58->debug_file);
          pcStack_370 = (code *)0x16fbe9;
          MIR_output_insn(pMVar61,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar54,
                          (pgVar58->curr_func_item->u).func,0);
          pcStack_370 = (code *)0x16fc03;
          fwrite(" which was ",0xb,1,(FILE *)pgVar58->debug_file);
          ((DLIST_in_edge_t *)(pDVar68 + 1))->head = peStack_1d8;
          ((DLIST_in_edge_t *)(pDVar68 + 1))->tail = peStack_1d0;
          ((DLIST_out_edge_t *)(pDVar68 + 2))->head = peStack_1c8;
          ((DLIST_out_edge_t *)(pDVar68 + 2))->tail = peStack_1c0;
          pDVar68->prev = pbStack_1e8;
          pDVar68->next = pbStack_1e0;
          ((DLIST_in_edge_t *)(pDVar68 + 1))->head = peStack_1d8;
          ((DLIST_in_edge_t *)(pDVar68 + 1))->tail = peStack_1d0;
          pgVar54->temp_bitmap3 = pVStack_1a8;
          pgVar54->call_used_hard_regs[0] = pVStack_1a0;
          pgVar54->call_used_hard_regs[1] = pVStack_198;
          pgVar54->call_used_hard_regs[2] = pVStack_190;
          ((DLIST_bb_insn_t *)&pgVar54->temp_bitmap)->head = pbStack_1b8;
          pgVar54->temp_bitmap2 = (bitmap_t)pbStack_1b0;
          pgVar54->temp_bitmap3 = pVStack_1a8;
          pgVar54->call_used_hard_regs[0] = pVStack_1a0;
          pcStack_370 = (code *)0x16fc5d;
          MIR_output_insn(pMVar61,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar54,
                          (pgVar58->curr_func_item->u).func,1);
        }
        if ((((pgVar58->optimize_level != 0) &&
             (pMVar61 = pgVar54->ctx, pMVar61 != (MIR_context_t)0x0)) &&
            ((MIR_context_t)pMVar61->temp_string[3].size == pMVar61)) &&
           ((MIR_context_t)pMVar61->temp_string[3].varr == pMVar61)) {
          pcStack_370 = (code *)0x16fc8e;
          pMVar34 = MIR_new_insn_arr(pgVar58->ctx,MIR_USE,0,(MIR_op_t *)0x0);
          pcStack_370 = (code *)0x16fca4;
          MIR_insert_insn_before
                    (pgVar58->ctx,pgVar58->curr_func_item,(MIR_insn_t_conflict)pMVar61->gen_ctx,
                     pMVar34);
          pcStack_370 = (code *)0x16fcb5;
          add_new_bb_insn(pgVar58,pMVar34,(bb_t_conflict)pMVar61->temp_string,0);
        }
        pcStack_370 = (code *)0x16fcc0;
        gen_delete_insn(pgVar58,(MIR_insn_t)pgVar54);
        iVar40 = 1;
      }
    }
    return iVar40;
  }
  if ((int)(uStack_2ac & uStack_2a8) < 0) {
LAB_0016fdfe:
    pcStack_370 = (code *)0x16fe1d;
    __assert_fail("in_mem_op_num >= 0 || out_mem_op_num >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1ebb,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
  }
  pMVar62 = pgVar58->ctx;
  uVar67 = (ulong)uStack_2ac;
  pDVar47 = (DLIST_in_edge_t *)(ulong)uStack_2a8;
  uVar41 = uStack_2ac;
  if (-1 < (int)uStack_2a8) {
    uVar41 = uStack_2a8;
  }
  lVar45 = (long)(int)uVar41;
  uVar41 = *(uint *)&pDStack_298[lVar45 * 3 + 2].prev;
  uVar33 = (ulong)*(uint *)((long)&pDStack_298[lVar45 * 3 + 2].prev + 4);
  if (-1 < (int)(uStack_2ac | uStack_2a8)) {
    pDVar68 = pDStack_298 + uVar67 * 3;
    pcStack_370 = (code *)0x16ef15;
    op1._12_4_ = (int)((ulong)pDVar68->next >> 0x20);
    op1._0_12_ = *(undefined1 (*) [12])pDVar68;
    op1.u.i = (int64_t)((DLIST_in_edge_t *)(pDVar68 + 1))->head;
    op1.u.mem.nonalias = (int)((DLIST_in_edge_t *)(pDVar68 + 1))->tail;
    op1.u.mem.nloc = (int)((ulong)((DLIST_in_edge_t *)(pDVar68 + 1))->tail >> 0x20);
    op1.u._16_8_ = pDStack_298[uVar67 * 3 + 2].prev;
    op1.u.mem.disp = (MIR_disp_t)pDStack_298[uVar67 * 3 + 2].next;
    op2.u._16_8_ = pDStack_298[(long)pDVar47 * 3 + 2].prev;
    op2._0_32_ = *(undefined1 (*) [32])(pDStack_298 + (long)pDVar47 * 3);
    op2.u.mem.disp = (MIR_disp_t)pDStack_298[(long)pDVar47 * 3 + 2].next;
    iVar40 = MIR_op_eq_p(pMVar62,op1,op2);
    if (iVar40 == 0) {
      pcStack_370 = (code *)0x16fe99;
      __assert_fail("in_mem_op_num < 0 || out_mem_op_num < 0 || MIR_op_eq_p (ctx, ops[in_mem_op_num], ops[out_mem_op_num])"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1ec0,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
    }
    prVar32 = pgVar58->ra_ctx;
  }
  pVVar14 = prVar32->reg_renumber;
  pDStack_2a0 = pDVar47;
  if (((pVVar14 == (VARR_MIR_reg_t *)0x0) || (pVVar14->varr == (MIR_reg_t *)0x0)) ||
     (pVVar14->els_num <= (ulong)uVar41)) {
LAB_0016fdc8:
    pcStack_370 = (code *)0x16fdcd;
    rewrite_insn_cold_20();
  }
  else {
    pcStack_370 = (code *)0x16efa3;
    add_ld_st(pgVar58,&MStack_218,pVVar14->varr[uVar41],base_reg,MIR_OP_INT,10,0,10,
              (MIR_insn_t)pgVar54,0);
    pDVar68 = pDStack_298;
    pVVar14 = pgVar58->ra_ctx->reg_renumber;
    if (((pVVar14 != (VARR_MIR_reg_t *)0x0) && (pVVar14->varr != (MIR_reg_t *)0x0)) &&
       (uVar33 < pVVar14->els_num)) {
      pcStack_370 = (code *)0x16f01f;
      add_ld_st(pgVar58,&MStack_218,pVVar14->varr[uVar33],base_reg,MIR_OP_INT,0xb,0,0xb,
                (MIR_insn_t)pgVar54,0);
      pcStack_370 = (code *)0x16f034;
      _MIR_new_var_op(pMVar62,10);
      pcStack_370 = (code *)0x16f049;
      _MIR_new_var_op(pMVar62,0xb);
      bVar4 = *(undefined1 *)((long)&pDVar68[lVar45 * 3 + 1].prev + 1);
      uVar33 = (ulong)bVar4;
      if (bVar4 == 0) {
        iVar35 = -1;
LAB_0016f08a:
        pcStack_370 = (code *)0x16f09d;
        MIR_new_int_op(pMVar62,iVar35);
        pcStack_370 = (code *)0x16f0ef;
        pMVar34 = MIR_new_insn(pMVar62,MIR_LSH);
        pcStack_370 = (code *)0x16f100;
        gen_add_insn_before(pgVar58,(MIR_insn_t)pgVar54,pMVar34);
        if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
          pcStack_370 = (code *)0x16f126;
          fwrite("      ",6,1,(FILE *)pgVar58->debug_file);
          pcStack_370 = (code *)0x16f143;
          MIR_output_insn(pMVar62,pgVar58->debug_file,pMVar34,(pgVar58->curr_func_item->u).func,1);
        }
      }
      else if (bVar4 != 1) {
        lVar45 = 0;
        uVar59 = uVar33;
        if ((bVar4 & 1) == 0) {
          do {
            lVar45 = lVar45 + 1;
            uVar33 = uVar59 >> 1;
            uVar43 = uVar59 & 2;
            uVar59 = uVar33;
          } while (uVar43 == 0);
        }
        iVar35 = -1;
        if (uVar33 == 1) {
          iVar35 = lVar45;
        }
        goto LAB_0016f08a;
      }
      pcStack_370 = (code *)0x16f19c;
      pMVar34 = MIR_new_insn(pMVar62,MIR_ADD);
      pcStack_370 = (code *)0x16f1ad;
      gen_add_insn_before(pgVar58,(MIR_insn_t)pgVar54,pMVar34);
      if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
        pcStack_370 = (code *)0x16f1d3;
        fwrite("      ",6,1,(FILE *)pgVar58->debug_file);
        pcStack_370 = (code *)0x16f1f0;
        MIR_output_insn(pMVar62,pgVar58->debug_file,pMVar34,(pgVar58->curr_func_item->u).func,1);
      }
      if (-1 < (int)uStack_2a8) {
        pDStack_298[(long)pDStack_2a0 * 3 + 2].prev = (bb_t)0xffffffff0000000a;
      }
      if (-1 < (int)uStack_2ac) {
        pDStack_298[uVar67 * 3 + 2].prev = (bb_t)0xffffffff0000000a;
      }
      pcStack_370 = (code *)0x16f25c;
      get_reload_hreg(pgVar58,0xffffffff,6,0);
      goto LAB_0016f25c;
    }
  }
  pcStack_370 = (code *)0x16fdd2;
  rewrite_insn_cold_19();
LAB_0016fdd2:
  pcStack_370 = (code *)0x16fdd7;
  rewrite_insn_cold_17();
LAB_0016fdd7:
  pcStack_370 = (code *)0x16fdf9;
  __assert_fail("insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1fb5,"int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)")
  ;
LAB_0016e21b:
  pcStack_40 = (code *)0x16e220;
  gap_lr_spill_cost_cold_1();
LAB_0016e220:
  pcStack_40 = (code *)0x16e225;
  gap_lr_spill_cost_cold_2();
  unaff_RBX = gen_ctx;
  goto LAB_0016e225;
LAB_00170360:
  if ((iVar28 != -1) && (*(int *)((long)pvVar13 + lVar65 + lVar45 + 4) == iVar28)) {
    return *(int *)((long)pvVar13 + lVar65 + 8 + lVar45);
  }
  iVar29 = *(int *)((long)pvVar13 + lVar65 + lVar45 + 8);
  if (uVar64 == 0) {
    iVar42 = 10;
    if (uVar41 < 3) {
      iVar42 = *(int *)(&DAT_001b1a90 + (ulong)uVar41 * 4);
    }
    uVar5 = 1;
    if (iVar29 != iVar42) goto LAB_00170398;
  }
  else {
LAB_00170398:
    iVar42 = 0xb;
    if (uVar41 < 3) {
      iVar42 = *(int *)(&DAT_001b1a9c + (ulong)uVar41 * 4);
    }
    uVar5 = uVar64;
    if (iVar29 == iVar42) {
      uVar5 = 2;
    }
  }
  uVar64 = uVar5;
  lVar65 = lVar65 + 0xc;
  if (lVar63 * 0xc == lVar65) {
    if (1 < uVar64) {
      __assert_fail("rld_num <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
    }
LAB_001703e4:
    if (extraout_EDX == 10) {
      iVar29 = -1;
    }
    else {
      if ((extraout_EDX == 9) || (extraout_EDX == 8)) {
        iVar29 = 0x19;
      }
      else {
        iVar29 = 0xb;
      }
      iVar29 = iVar29 - (uint)(uVar64 == 0);
    }
    *(int *)((long)pvVar13 + uVar67 * 4 + 0x180) = iVar40 + 1;
    if (iVar40 < 8) {
      *(int *)((long)pvVar13 + lVar63 * 0xc + lVar45 + 4) = iVar28;
      *(int *)((long)pvVar13 + lVar63 * 0xc + lVar45) = extraout_EDX;
      *(int *)((long)pvVar13 + lVar63 * 0xc + lVar45 + 8) = iVar29;
      return iVar29;
    }
    __assert_fail("rld_num < (2 * 4)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
  }
  goto LAB_00170360;
LAB_0017022a:
  spill_restore_reg_cold_7();
LAB_0017022f:
  __assert_fail("reg != (4294967295U) && reg < (VARR_spill_cache_el_tlength (gen_ctx->ra_ctx->spill_cache))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1e94,"int get_spill_mem_loc(gen_ctx_t, MIR_reg_t)");
}

Assistant:

static int gap_lr_spill_cost (gen_ctx_t gen_ctx, live_range_t lr) {
  int cost_factor = LOOP_COST_FACTOR / 2;
  bitmap_clear (temp_bitmap);
  for (lr_bb_t lr_bb = lr->lr_bb; lr_bb != NULL; lr_bb = lr_bb->next)
    bitmap_set_bit_p (temp_bitmap, lr_bb->bb->index);
  int cost = 0;
  for (lr_bb_t lr_bb = lr->lr_bb; lr_bb != NULL; lr_bb = lr_bb->next) {
    bb_t bb = lr_bb->bb;
    int level, max_level, bb_level = bb_loop_level (bb) + 1;
    edge_t e;
    max_level = -1;
    for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e))
      if (!bitmap_bit_p (temp_bitmap, e->dst->index)
          && (level = bb_loop_level (e->dst) + 1) > max_level)
        max_level = level;
    if (max_level >= 0) cost += (max_level < bb_level ? max_level : bb_level) * cost_factor;
    max_level = -1;
    for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e))
      if (!bitmap_bit_p (temp_bitmap, e->src->index)
          && (level = bb_loop_level (e->src) + 1) > max_level)
        max_level = level;
    if (max_level >= 0) cost += (max_level < bb_level ? max_level : bb_level) * cost_factor;
  }
  return cost;
}